

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::MatchLiteralNode::BuildCharTrie
          (MatchLiteralNode *this,Compiler *compiler,CharTrie *trie,Node *cont,bool isAcceptFirst)

{
  int *piVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  CharTrie *pCVar6;
  CharCount i;
  uint uVar7;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  uVar7 = 0;
  if (this->isEquivClass == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x469,"(!isEquivClass)","!isEquivClass");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    uVar7 = 0;
  }
  while( true ) {
    if (this->length <= uVar7) {
      if (cont == (Node *)0x0) {
        if (0 < trie->count) {
          return false;
        }
        trie->isAccepting = true;
      }
      else {
        iVar4 = (*cont->_vptr_Node[0x15])(cont,compiler,trie,0,isAcceptFirst);
        if ((char)iVar4 == '\0') {
          return false;
        }
      }
      return true;
    }
    if (trie->isAccepting != false) break;
    pCVar6 = CharTrie::Add(trie,compiler->ctAllocator,
                           (compiler->program->rep).insts.litbuf.ptr[this->offset + uVar7]);
    uVar7 = uVar7 + 1;
    piVar1 = &trie->count;
    trie = pCVar6;
    if (0x10 < *piVar1) {
      return false;
    }
  }
  return isAcceptFirst;
}

Assistant:

bool MatchLiteralNode::BuildCharTrie(Compiler& compiler, CharTrie* trie, Node* cont, bool isAcceptFirst) const
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(!isEquivClass);
        CharTrie* tail = trie;
        for (CharCount i = 0; i < length; i++)
        {
            if (tail->IsAccepting())
            {
                // An earlier literal is a prefix of this literal
                // If isAcceptFirst, can ignore suffix of already recognized literal.
                // Otherwise, must fail.
                return isAcceptFirst;
            }
            CharTrie* newTail = tail->Add(compiler.ctAllocator, compiler.program->rep.insts.litbuf[offset + i]);
            if (tail->Count() > maxTrieArmExpansion)
                return false;
            tail = newTail;
        }
        if (cont == 0)
        {
            if (tail->Count() > 0)
                // This literal is a proper prefix of an earlier literal
                return false;
            tail->SetAccepting();
        }
        else
        {
            if (!cont->BuildCharTrie(compiler, tail, 0, isAcceptFirst))
                return false;
        }
        return true;
    }